

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBase.cpp
# Opt level: O2

void Diligent::ValidateBufferDesc(BufferDesc *Desc,IRenderDevice *pDevice)

{
  char *pcVar1;
  BUFFER_MODE Mode;
  CPU_ACCESS_FLAGS CVar2;
  USAGE UVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar6;
  undefined4 extraout_var_01;
  long lVar7;
  BIND_FLAGS BVar8;
  char local_59;
  string msg;
  Char *local_38;
  long lVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_02;
  
  iVar4 = (*(pDevice->super_IObject)._vptr_IObject[0x19])(pDevice);
  lVar5 = CONCAT44(extraout_var,iVar4);
  iVar4 = (*(pDevice->super_IObject)._vptr_IObject[0x18])();
  lVar6 = CONCAT44(extraout_var_00,iVar4);
  BVar8 = Desc->BindFlags;
  if ((BVar8 & ~(BIND_RAY_TRACING|BIND_INDIRECT_DRAW_ARGS|BIND_UNORDERED_ACCESS|BIND_STREAM_OUTPUT|
                 BIND_SHADER_RESOURCE|BIND_UNIFORM_BUFFER|BIND_INDEX_BUFFER|BIND_VERTEX_BUFFER)) !=
      BIND_NONE) {
    pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
    local_38 = "";
    if (pcVar1 != (char *)0x0) {
      local_38 = pcVar1;
    }
    GetBindFlagsString_abi_cxx11_
              (&msg,(Diligent *)
                    (ulong)(BVar8 & ~(BIND_RAY_TRACING|BIND_INDIRECT_DRAW_ARGS|BIND_UNORDERED_ACCESS
                                      |BIND_STREAM_OUTPUT|BIND_SHADER_RESOURCE|BIND_UNIFORM_BUFFER|
                                      BIND_INDEX_BUFFER|BIND_VERTEX_BUFFER)),0x800c44,local_38);
    local_59 = '.';
    LogError<true,char[24],char_const*,char[15],char[56],std::__cxx11::string,char>
              (false,"ValidateBufferDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
               ,0x3f,(char (*) [24])"Description of buffer \'",&local_38,
               (char (*) [15])"\' is invalid: ",
               (char (*) [56])"the following bind flags are not allowed for a buffer: ",&msg,
               &local_59);
    std::__cxx11::string::~string((string *)&msg);
    BVar8 = Desc->BindFlags;
  }
  if ((BVar8 & (BIND_UNORDERED_ACCESS|BIND_SHADER_RESOURCE)) != BIND_NONE) {
    Mode = Desc->Mode;
    if (2 < (byte)(Mode - BUFFER_MODE_FORMATTED)) {
      pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar1 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar1;
      }
      local_38 = GetBufferModeString(Mode);
      LogError<true,char[24],char_const*,char[15],char_const*,char[100]>
                (false,"ValidateBufferDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,0x44,(char (*) [24])"Description of buffer \'",(char **)&msg,
                 (char (*) [15])"\' is invalid: ",&local_38,
                 (char (*) [100])
                 " is not a valid mode for a buffer created with BIND_SHADER_RESOURCE or BIND_UNORDERED_ACCESS flags."
                );
      Mode = Desc->Mode;
    }
    if ((Mode == BUFFER_MODE_FORMATTED) && (*(char *)(lVar6 + 0x3a) == '\0')) {
      pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar1 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar1;
      }
      LogError<true,char[24],char_const*,char[15],char[90]>
                (false,"ValidateBufferDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,0x46,(char (*) [24])"Description of buffer \'",(char **)&msg,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [90])
                 "the device does not support formatted buffers. Check the FormattedBuffers device feature."
                );
      Mode = Desc->Mode;
    }
    if (((byte)(Mode - BUFFER_MODE_FORMATTED) < 2) && (Desc->ElementByteStride == 0)) {
      pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar1 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar1;
      }
      LogError<true,char[24],char_const*,char[15],char[70]>
                (false,"ValidateBufferDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,0x4a,(char (*) [24])"Description of buffer \'",(char **)&msg,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [70])
                 "element stride must not be zero for structured and formatted buffers.");
    }
  }
  BVar8 = Desc->BindFlags;
  if (((BVar8 >> 10 & 1) != 0) && (*(char *)(lVar6 + 0x14) == '\0')) {
    pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
    msg._M_dataplus._M_p = "";
    if (pcVar1 != (char *)0x0) {
      msg._M_dataplus._M_p = pcVar1;
    }
    LogError<true,char[24],char_const*,char[15],char[76]>
              (false,"ValidateBufferDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
               ,0x53,(char (*) [24])"Description of buffer \'",(char **)&msg,
               (char (*) [15])"\' is invalid: ",
               (char (*) [76])
               "BIND_RAY_TRACING flag can\'t be used when RayTracing feature is not enabled.");
    BVar8 = Desc->BindFlags;
  }
  if (((BVar8 >> 8 & 1) != 0) &&
     (iVar4 = (*(pDevice->super_IObject)._vptr_IObject[0x19])(),
     (*(byte *)(CONCAT44(extraout_var_01,iVar4) + 0x194) & 2) == 0)) {
    pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
    msg._M_dataplus._M_p = "";
    if (pcVar1 != (char *)0x0) {
      msg._M_dataplus._M_p = pcVar1;
    }
    LogError<true,char[24],char_const*,char[15],char[112]>
              (false,"ValidateBufferDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
               ,0x58,(char (*) [24])"Description of buffer \'",(char **)&msg,
               (char (*) [15])"\' is invalid: ",
               (char (*) [112])
               "BIND_INDIRECT_DRAW_ARGS flag can\'t be used when DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT capability is not supported"
              );
  }
  switch(Desc->Usage) {
  case USAGE_IMMUTABLE:
  case USAGE_DEFAULT:
    if (Desc->CPUAccessFlags != CPU_ACCESS_NONE) {
      pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar1 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar1;
      }
      LogError<true,char[24],char_const*,char[15],char[64]>
                (false,"ValidateBufferDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,0x5f,(char (*) [24])"Description of buffer \'",(char **)&msg,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [64])"static and default buffers can\'t have any CPU access flags set.");
    }
    break;
  case USAGE_DYNAMIC:
    if (Desc->CPUAccessFlags != CPU_ACCESS_FLAG_LAST) {
      pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar1 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar1;
      }
      LogError<true,char[24],char_const*,char[15],char[47]>
                (false,"ValidateBufferDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,99,(char (*) [24])"Description of buffer \'",(char **)&msg,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [47])"dynamic buffers require CPU_ACCESS_WRITE flag.");
      break;
    }
    goto LAB_005805cd;
  case USAGE_STAGING:
    if (1 < (byte)(Desc->CPUAccessFlags - CPU_ACCESS_READ)) {
      pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar1 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar1;
      }
      LogError<true,char[24],char_const*,char[15],char[97]>
                (false,"ValidateBufferDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,0x68,(char (*) [24])"Description of buffer \'",(char **)&msg,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [97])
                 "exactly one of CPU_ACCESS_WRITE or CPU_ACCESS_READ flags must be specified for a staging buffer."
                );
    }
    if (Desc->BindFlags != BIND_NONE) {
      pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar1 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar1;
      }
      LogError<true,char[24],char_const*,char[15],char[104]>
                (false,"ValidateBufferDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,0x6a,(char (*) [24])"Description of buffer \'",(char **)&msg,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [104])
                 "staging buffers cannot be bound to any part of the graphics pipeline and can\'t have any bind flags set."
                );
    }
    break;
  case USAGE_UNIFIED:
    if (*(long *)(lVar5 + 0xa0) == 0) {
      pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar1 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar1;
      }
      LogError<true,char[24],char_const*,char[15],char[143]>
                (false,"ValidateBufferDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,0x70,(char (*) [24])"Description of buffer \'",(char **)&msg,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [143])
                 "Unified memory is not present on this device. Check the amount of available unified memory in the device caps before creating unified buffers."
                );
    }
    CVar2 = Desc->CPUAccessFlags;
    if (CVar2 == CPU_ACCESS_NONE) {
      pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar1 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar1;
      }
      LogError<true,char[24],char_const*,char[15],char[98]>
                (false,"ValidateBufferDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,0x72,(char (*) [24])"Description of buffer \'",(char **)&msg,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [98])
                 "at least one of CPU_ACCESS_WRITE or CPU_ACCESS_READ flags must be specified for a unified buffer."
                );
      CVar2 = Desc->CPUAccessFlags;
    }
    if (((CVar2 & CPU_ACCESS_FLAG_LAST) != CPU_ACCESS_NONE) && ((*(byte *)(lVar5 + 0xb0) & 2) == 0))
    {
      pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar1 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar1;
      }
      LogError<true,char[24],char_const*,char[15],char[146]>
                (false,"ValidateBufferDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,0x77,(char (*) [24])"Description of buffer \'",(char **)&msg,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [146])
                 "Unified memory on this device does not support write access. Check the available access flags in the device caps before creating unified buffers."
                );
      CVar2 = Desc->CPUAccessFlags;
    }
    if (((CVar2 & CPU_ACCESS_READ) != CPU_ACCESS_NONE) && ((*(byte *)(lVar5 + 0xb0) & 1) == 0)) {
      pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar1 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar1;
      }
      LogError<true,char[24],char_const*,char[15],char[145]>
                (false,"ValidateBufferDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,0x7d,(char (*) [24])"Description of buffer \'",(char **)&msg,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [145])
                 "Unified memory on this device does not support read access. Check the available access flags in the device caps before creating unified buffers."
                );
    }
    break;
  case USAGE_SPARSE:
    iVar4 = (*(pDevice->super_IObject)._vptr_IObject[0x19])();
    lVar7 = CONCAT44(extraout_var_02,iVar4);
    if (*(char *)(lVar6 + 0x34) == '\0') {
      pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar1 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar1;
      }
      LogError<true,char[24],char_const*,char[15],char[47]>
                (false,"ValidateBufferDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,0x84,(char (*) [24])"Description of buffer \'",(char **)&msg,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [47])"sparse buffer requires SparseResources feature");
    }
    if (Desc->CPUAccessFlags != CPU_ACCESS_NONE) {
      pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar1 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar1;
      }
      LogError<true,char[24],char_const*,char[15],char[52]>
                (false,"ValidateBufferDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,0x85,(char (*) [24])"Description of buffer \'",(char **)&msg,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [52])"sparse buffers can\'t have any CPU access flags set.");
    }
    if (*(ulong *)(lVar7 + 0x1a8) < Desc->Size) {
      pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar1 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar1;
      }
      LogError<true,char[24],char_const*,char[15],char[21],unsigned_long,char[42],unsigned_long,char[2]>
                (false,"ValidateBufferDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,0x86,(char (*) [24])"Description of buffer \'",(char **)&msg,
                 (char (*) [15])"\' is invalid: ",(char (*) [21])0x7e7457,&Desc->Size,
                 (char (*) [42])") must not exceed the ResourceSpaceSize (",
                 (unsigned_long *)(lVar7 + 0x1a8),(char (*) [2])0x801c00);
    }
    if ((*(byte *)(lVar7 + 0x1b0) & 2) == 0) {
      pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar1 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar1;
      }
      LogError<true,char[24],char_const*,char[15],char[66]>
                (false,"ValidateBufferDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,0x87,(char (*) [24])"Description of buffer \'",(char **)&msg,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [66])"sparse buffer requires SPARSE_RESOURCE_CAP_FLAG_BUFFER capability")
      ;
    }
    if (((Desc->MiscFlags & MISC_BUFFER_FLAG_SPARSE_ALIASING) != MISC_BUFFER_FLAG_NONE) &&
       ((*(byte *)(lVar7 + 0x1b1) & 1) == 0)) {
      pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar1 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar1;
      }
      LogError<true,char[24],char_const*,char[15],char[91]>
                (false,"ValidateBufferDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,0x89,(char (*) [24])"Description of buffer \'",(char **)&msg,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [91])
                 "MISC_BUFFER_FLAG_SPARSE_ALIASING flag requires SPARSE_RESOURCE_CAP_FLAG_ALIASED capability"
                );
    }
    BVar8 = ~*(uint *)(lVar7 + 0x1b8) & Desc->BindFlags;
    if (BVar8 != BIND_NONE) {
      pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
      local_38 = "";
      if (pcVar1 != (char *)0x0) {
        local_38 = pcVar1;
      }
      GetBindFlagsString_abi_cxx11_(&msg,(Diligent *)(ulong)BVar8,0x800c44,local_38);
      local_59 = '.';
      LogError<true,char[24],char_const*,char[15],char[62],std::__cxx11::string,char>
                (false,"ValidateBufferDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,0x8b,(char (*) [24])"Description of buffer \'",&local_38,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [62])"the following bind flags are not allowed for sparse buffers: ",&msg
                 ,&local_59);
      goto LAB_00580458;
    }
    break;
  default:
    FormatString<char[14]>(&msg,(char (*) [14])"Unknown usage");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ValidateBufferDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
               ,0x90);
LAB_00580458:
    std::__cxx11::string::~string((string *)&msg);
  }
  UVar3 = Desc->Usage;
  if (UVar3 == USAGE_DYNAMIC) {
LAB_005805cd:
    if (((Desc->ImmediateContextMask & Desc->ImmediateContextMask - 1) == 0) ||
       (((Desc->BindFlags & BIND_UNORDERED_ACCESS) == BIND_NONE &&
        (Desc->Mode != BUFFER_MODE_FORMATTED)))) goto LAB_0058063e;
    pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
    msg._M_dataplus._M_p = "";
    if (pcVar1 != (char *)0x0) {
      msg._M_dataplus._M_p = pcVar1;
    }
    LogError<true,char[24],char_const*,char[15],char[375]>
              (false,"ValidateBufferDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
               ,0x9c,(char (*) [24])"Description of buffer \'",(char **)&msg,
               (char (*) [15])"\' is invalid: ",
               (char (*) [375])
               "USAGE_DYNAMIC buffers that use UAV flag or FORMATTED mode require internal backing resource. This resource is implicitly transitioned by the device context and thus can\'t be safely used in multiple contexts. Create DYNAMIC buffer without UAV flag and use UNDEFINED mode and copy the contents to USAGE_DEFAULT buffer with required flags, which can be shared between contexts."
              );
    UVar3 = Desc->Usage;
  }
  if (UVar3 == USAGE_SPARSE) {
    return;
  }
LAB_0058063e:
  if ((*(ulong *)(lVar5 + 0xa8) != 0) && (*(ulong *)(lVar5 + 0xa8) < Desc->Size)) {
    pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
    msg._M_dataplus._M_p = "";
    if (pcVar1 != (char *)0x0) {
      msg._M_dataplus._M_p = pcVar1;
    }
    LogError<true,char[24],char_const*,char[15],char[25],unsigned_long,char[48],unsigned_long,char[2]>
              (false,"ValidateBufferDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
               ,0xa3,(char (*) [24])"Description of buffer \'",(char **)&msg,
               (char (*) [15])"\' is invalid: ",(char (*) [25])"non-sparse buffer size (",
               &Desc->Size,(char (*) [48])") must not exceed the maximum allocation size (",
               (unsigned_long *)(lVar5 + 0xa8),(char (*) [2])0x801c00);
  }
  if ((Desc->MiscFlags & MISC_BUFFER_FLAG_SPARSE_ALIASING) != MISC_BUFFER_FLAG_NONE) {
    pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
    msg._M_dataplus._M_p = "";
    if (pcVar1 != (char *)0x0) {
      msg._M_dataplus._M_p = pcVar1;
    }
    LogError<true,char[24],char_const*,char[15],char[86]>
              (false,"ValidateBufferDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
               ,0xa5,(char (*) [24])"Description of buffer \'",(char **)&msg,
               (char (*) [15])"\' is invalid: ",
               (char (*) [86])
               "MiscFlags must not have MISC_BUFFER_FLAG_SPARSE_ALIASING if usage is not USAGE_SPARSE"
              );
  }
  return;
}

Assistant:

void ValidateBufferDesc(const BufferDesc& Desc, const IRenderDevice* pDevice) noexcept(false)
{
    const AdapterMemoryInfo& MemoryInfo = pDevice->GetAdapterInfo().Memory;
    const DeviceFeatures&    Features   = pDevice->GetDeviceInfo().Features;

    static_assert(BIND_FLAG_LAST == 0x800L, "Please update this function to handle the new bind flags");

    constexpr Uint32 AllowedBindFlags =
        BIND_VERTEX_BUFFER |
        BIND_INDEX_BUFFER |
        BIND_UNIFORM_BUFFER |
        BIND_SHADER_RESOURCE |
        BIND_STREAM_OUTPUT |
        BIND_UNORDERED_ACCESS |
        BIND_INDIRECT_DRAW_ARGS |
        BIND_RAY_TRACING;

    VERIFY_BUFFER((Desc.BindFlags & ~AllowedBindFlags) == 0, "the following bind flags are not allowed for a buffer: ", GetBindFlagsString(Desc.BindFlags & ~AllowedBindFlags, ", "), '.');

    if ((Desc.BindFlags & BIND_UNORDERED_ACCESS) ||
        (Desc.BindFlags & BIND_SHADER_RESOURCE))
    {
        VERIFY_BUFFER(Desc.Mode > BUFFER_MODE_UNDEFINED && Desc.Mode < BUFFER_MODE_NUM_MODES, GetBufferModeString(Desc.Mode), " is not a valid mode for a buffer created with BIND_SHADER_RESOURCE or BIND_UNORDERED_ACCESS flags.");
        if (Desc.Mode == BUFFER_MODE_FORMATTED)
            VERIFY_BUFFER(Features.FormattedBuffers, "the device does not support formatted buffers. Check the FormattedBuffers device feature.");

        if (Desc.Mode == BUFFER_MODE_STRUCTURED || Desc.Mode == BUFFER_MODE_FORMATTED)
        {
            VERIFY_BUFFER(Desc.ElementByteStride != 0, "element stride must not be zero for structured and formatted buffers.");
        }
        else if (Desc.Mode == BUFFER_MODE_RAW)
        {
            // Nothing needs to be done
        }
    }

    if ((Desc.BindFlags & BIND_RAY_TRACING) != 0)
        VERIFY_BUFFER(Features.RayTracing, "BIND_RAY_TRACING flag can't be used when RayTracing feature is not enabled.");

    if ((Desc.BindFlags & BIND_INDIRECT_DRAW_ARGS) != 0)
    {
        VERIFY_BUFFER((pDevice->GetAdapterInfo().DrawCommand.CapFlags & DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT) != 0,
                      "BIND_INDIRECT_DRAW_ARGS flag can't be used when DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT capability is not supported");
    }

    switch (Desc.Usage)
    {
        case USAGE_IMMUTABLE:
        case USAGE_DEFAULT:
            VERIFY_BUFFER(Desc.CPUAccessFlags == CPU_ACCESS_NONE, "static and default buffers can't have any CPU access flags set.");
            break;

        case USAGE_DYNAMIC:
            VERIFY_BUFFER(Desc.CPUAccessFlags == CPU_ACCESS_WRITE, "dynamic buffers require CPU_ACCESS_WRITE flag.");
            break;

        case USAGE_STAGING:
            VERIFY_BUFFER(Desc.CPUAccessFlags == CPU_ACCESS_WRITE || Desc.CPUAccessFlags == CPU_ACCESS_READ,
                          "exactly one of CPU_ACCESS_WRITE or CPU_ACCESS_READ flags must be specified for a staging buffer.");
            VERIFY_BUFFER(Desc.BindFlags == BIND_NONE,
                          "staging buffers cannot be bound to any part of the graphics pipeline and can't have any bind flags set.");
            break;

        case USAGE_UNIFIED:
            VERIFY_BUFFER(MemoryInfo.UnifiedMemory != 0,
                          "Unified memory is not present on this device. Check the amount of available unified memory "
                          "in the device caps before creating unified buffers.");
            VERIFY_BUFFER(Desc.CPUAccessFlags != CPU_ACCESS_NONE,
                          "at least one of CPU_ACCESS_WRITE or CPU_ACCESS_READ flags must be specified for a unified buffer.");
            if (Desc.CPUAccessFlags & CPU_ACCESS_WRITE)
            {
                VERIFY_BUFFER(MemoryInfo.UnifiedMemoryCPUAccess & CPU_ACCESS_WRITE,
                              "Unified memory on this device does not support write access. Check the available access flags "
                              "in the device caps before creating unified buffers.");
            }
            if (Desc.CPUAccessFlags & CPU_ACCESS_READ)
            {
                VERIFY_BUFFER(MemoryInfo.UnifiedMemoryCPUAccess & CPU_ACCESS_READ,
                              "Unified memory on this device does not support read access. Check the available access flags "
                              "in the device caps before creating unified buffers.");
            }
            break;

        case USAGE_SPARSE:
        {
            const SparseResourceProperties& SparseRes = pDevice->GetAdapterInfo().SparseResources;
            VERIFY_BUFFER(Features.SparseResources, "sparse buffer requires SparseResources feature");
            VERIFY_BUFFER(Desc.CPUAccessFlags == CPU_ACCESS_NONE, "sparse buffers can't have any CPU access flags set.");
            VERIFY_BUFFER(Desc.Size <= SparseRes.ResourceSpaceSize, "sparse buffer size (", Desc.Size, ") must not exceed the ResourceSpaceSize (", SparseRes.ResourceSpaceSize, ")");
            VERIFY_BUFFER((SparseRes.CapFlags & SPARSE_RESOURCE_CAP_FLAG_BUFFER) != 0, "sparse buffer requires SPARSE_RESOURCE_CAP_FLAG_BUFFER capability");
            if ((Desc.MiscFlags & MISC_BUFFER_FLAG_SPARSE_ALIASING) != 0)
                VERIFY_BUFFER(SparseRes.CapFlags & SPARSE_RESOURCE_CAP_FLAG_ALIASED, "MISC_BUFFER_FLAG_SPARSE_ALIASING flag requires SPARSE_RESOURCE_CAP_FLAG_ALIASED capability");
            VERIFY_BUFFER((Desc.BindFlags & ~SparseRes.BufferBindFlags) == 0,
                          "the following bind flags are not allowed for sparse buffers: ", GetBindFlagsString(Desc.BindFlags & ~SparseRes.BufferBindFlags, ", "), '.');
            break;
        }

        default:
            UNEXPECTED("Unknown usage");
    }


    if (Desc.Usage == USAGE_DYNAMIC && PlatformMisc::CountOneBits(Desc.ImmediateContextMask) > 1)
    {
        bool NeedsBackingResource = (Desc.BindFlags & BIND_UNORDERED_ACCESS) != 0 || Desc.Mode == BUFFER_MODE_FORMATTED;
        if (NeedsBackingResource)
        {
            LOG_BUFFER_ERROR_AND_THROW("USAGE_DYNAMIC buffers that use UAV flag or FORMATTED mode require internal backing resource. "
                                       "This resource is implicitly transitioned by the device context and thus can't be safely used in "
                                       "multiple contexts. Create DYNAMIC buffer without UAV flag and use UNDEFINED mode and copy the contents to USAGE_DEFAULT buffer "
                                       "with required flags, which can be shared between contexts.");
        }
    }

    if (Desc.Usage != USAGE_SPARSE)
    {
        VERIFY_BUFFER(MemoryInfo.MaxMemoryAllocation == 0 || Desc.Size <= MemoryInfo.MaxMemoryAllocation,
                      "non-sparse buffer size (", Desc.Size, ") must not exceed the maximum allocation size (", MemoryInfo.MaxMemoryAllocation, ")");
        VERIFY_BUFFER((Desc.MiscFlags & MISC_BUFFER_FLAG_SPARSE_ALIASING) == 0,
                      "MiscFlags must not have MISC_BUFFER_FLAG_SPARSE_ALIASING if usage is not USAGE_SPARSE");
    }
}